

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O0

shared_ptr<mprpc::MpRpcMessage> __thiscall
mprpc::MpRpcMessage::parse(MpRpcMessage *this,char *utf8_buf,size_t len)

{
  uint uVar1;
  uint64_t uVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined4 uVar4;
  bool bVar5;
  msgpack_unpack_return mVar6;
  int iVar7;
  element_type *peVar8;
  char *pcVar9;
  size_t len_00;
  element_type *peVar10;
  msgpack_object *pmVar11;
  msgpack_object *pmVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mprpc::MpRpcMessage> sVar13;
  exception *e;
  msgpack_object_kv *p;
  uint32_t n;
  string str;
  msgpack_object_kv *o;
  uint32_t i;
  msgpack_unpack_return ret;
  undefined1 local_30 [8];
  shared_ptr<mprpc::MpRpcMessage> rpcmsg;
  size_t len_local;
  char *utf8_buf_local;
  
  rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)len;
  std::make_shared<mprpc::MpRpcMessage>();
  if (*utf8_buf == 'S') {
    p_Var3 = rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi + -1;
    peVar8 = std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    bVar5 = snappy::Uncompress(utf8_buf + 5,(size_t)((long)&p_Var3->_M_use_count + 3),
                               &peVar8->_recv_data);
    if (!bVar5) {
      std::shared_ptr<mprpc::MpRpcMessage>::shared_ptr
                ((shared_ptr<mprpc::MpRpcMessage> *)this,(nullptr_t)0x0);
      goto LAB_001c9acc;
    }
  }
  else {
    peVar8 = std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    std::__cxx11::string::assign((char *)&peVar8->_recv_data,(ulong)utf8_buf);
  }
  std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_30);
  len_00 = std::__cxx11::string::size();
  peVar8 = std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  peVar10 = std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_30);
  mVar6 = msgpack_unpack(pcVar9,len_00,(size_t *)0x0,&peVar8->mp_zone,&peVar10->root);
  if (mVar6 == MSGPACK_UNPACK_SUCCESS) {
    peVar8 = std::__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    bVar5 = is_map(&peVar8->root);
    if (bVar5) {
      for (o._0_4_ = 0;
          peVar8 = std::
                   __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_30), (uint)o < (peVar8->root).via.array.size;
          o._0_4_ = (uint)o + 1) {
        peVar8 = std::
                 __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_30);
        pmVar11 = (peVar8->root).via.array.ptr + (ulong)(uint)o * 2;
        if (pmVar11->type == MSGPACK_OBJECT_STR) {
          pcVar9 = (pmVar11->via).str.ptr;
          uVar1 = (pmVar11->via).array.size;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&n,pcVar9,(ulong)uVar1,(allocator *)((long)&p + 7))
          ;
          std::allocator<char>::~allocator((allocator<char> *)((long)&p + 7));
          bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&n,"id");
          if (bVar5) {
            if (pmVar11[1].type == MSGPACK_OBJECT_NEGATIVE_INTEGER) {
              uVar2 = pmVar11[1].via.u64;
              peVar8 = std::
                       __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_30);
              peVar8->id = (int)uVar2;
            }
            else if (pmVar11[1].type == MSGPACK_OBJECT_POSITIVE_INTEGER) {
              uVar2 = pmVar11[1].via.u64;
              peVar8 = std::
                       __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_30);
              peVar8->id = (int)uVar2;
            }
          }
          else {
            bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&n,"method");
            if (bVar5) {
              if (pmVar11[1].type == MSGPACK_OBJECT_STR) {
                peVar8 = std::
                         __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_30);
                std::__cxx11::string::assign((char *)peVar8,(ulong)pmVar11[1].via.array.ptr);
              }
            }
            else {
              bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&n,"params");
              if (bVar5) {
                peVar8 = std::
                         __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_30);
                uVar4 = *(undefined4 *)&pmVar11[1].field_0x4;
                (peVar8->params).type = pmVar11[1].type;
                *(undefined4 *)&(peVar8->params).field_0x4 = uVar4;
                (peVar8->params).via.u64 = pmVar11[1].via.u64;
                (peVar8->params).via.array.ptr = pmVar11[1].via.array.ptr;
              }
              else {
                bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&n,"result");
                if (bVar5) {
                  peVar8 = std::
                           __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_30);
                  uVar4 = *(undefined4 *)&pmVar11[1].field_0x4;
                  (peVar8->result).type = pmVar11[1].type;
                  *(undefined4 *)&(peVar8->result).field_0x4 = uVar4;
                  (peVar8->result).via.u64 = pmVar11[1].via.u64;
                  (peVar8->result).via.array.ptr = pmVar11[1].via.array.ptr;
                }
                else {
                  bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&n,"error");
                  if ((bVar5) && (pmVar11[1].type == MSGPACK_OBJECT_MAP)) {
                    for (p._0_4_ = 0; (uint)p < pmVar11[1].via.array.size; p._0_4_ = (uint)p + 1) {
                      pmVar12 = pmVar11[1].via.array.ptr + (ulong)(uint)p * 2;
                      if ((pmVar12->type == MSGPACK_OBJECT_STR) &&
                         (((pmVar12->via).array.ptr)->type == 0x65646f63)) {
                        if (pmVar12[1].type == MSGPACK_OBJECT_NEGATIVE_INTEGER) {
                          uVar2 = pmVar12[1].via.u64;
                          peVar8 = std::
                                   __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 *)local_30);
                          peVar8->err_code = (int)uVar2;
                        }
                        else if (pmVar12[1].type == MSGPACK_OBJECT_POSITIVE_INTEGER) {
                          uVar2 = pmVar12[1].via.u64;
                          peVar8 = std::
                                   __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                 *)local_30);
                          peVar8->err_code = (int)uVar2;
                        }
                      }
                      else if ((pmVar12->type == MSGPACK_OBJECT_STR) &&
                              ((iVar7 = memcmp((pmVar12->via).array.ptr,"message",7), iVar7 == 0 &&
                               (pmVar12[1].type == MSGPACK_OBJECT_STR)))) {
                        peVar8 = std::
                                 __shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 ::operator->((__shared_ptr_access<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                               *)local_30);
                        std::__cxx11::string::assign
                                  ((char *)&peVar8->err_msg,(ulong)pmVar12[1].via.array.ptr);
                      }
                    }
                  }
                }
              }
            }
          }
          std::__cxx11::string::~string((string *)&n);
        }
      }
      std::shared_ptr<mprpc::MpRpcMessage>::shared_ptr
                ((shared_ptr<mprpc::MpRpcMessage> *)this,(shared_ptr<mprpc::MpRpcMessage> *)local_30
                );
    }
    else {
      std::shared_ptr<mprpc::MpRpcMessage>::shared_ptr
                ((shared_ptr<mprpc::MpRpcMessage> *)this,(nullptr_t)0x0);
    }
  }
  else {
    std::shared_ptr<mprpc::MpRpcMessage>::shared_ptr
              ((shared_ptr<mprpc::MpRpcMessage> *)this,(nullptr_t)0x0);
  }
LAB_001c9acc:
  std::shared_ptr<mprpc::MpRpcMessage>::~shared_ptr((shared_ptr<mprpc::MpRpcMessage> *)local_30);
  sVar13.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar13.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<mprpc::MpRpcMessage>)
         sVar13.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<MpRpcMessage> MpRpcMessage::parse(const char* utf8_buf, size_t len)
    {
        auto rpcmsg = make_shared<MpRpcMessage>();

        try {
            if (utf8_buf[0] == 'S') {
                //uint32_t orig_len = *(uint32_t*)(utf8_buf + 1);
                if (!snappy::Uncompress(utf8_buf + 5, len - 5, &rpcmsg->_recv_data))
                    return nullptr;
            }
            else {
                rpcmsg->_recv_data.assign(utf8_buf, len);
            }
            msgpack_unpack_return ret = msgpack_unpack(rpcmsg->_recv_data.c_str(), rpcmsg->_recv_data.size(),
                                                       nullptr, &rpcmsg->mp_zone, &rpcmsg->root);
            if ( ret != MSGPACK_UNPACK_SUCCESS)
                return nullptr;

            if (!is_map(rpcmsg->root)) return nullptr;

            for (uint32_t i = 0; i < rpcmsg->root.via.map.size; i++) {
                auto o = rpcmsg->root.via.map.ptr + i;
                if (o->key.type != MSGPACK_OBJECT_STR) continue;
                const string str(o->key.via.str.ptr, o->key.via.str.size);
                if (str == "id") {
                    if (o->val.type == MSGPACK_OBJECT_NEGATIVE_INTEGER)
                        rpcmsg->id = (int)o->val.via.i64;
                    else if (o->val.type == MSGPACK_OBJECT_POSITIVE_INTEGER)
                        rpcmsg->id = (int)o->val.via.u64;
                }
                else if (str == "method") {
                    if (o->val.type == MSGPACK_OBJECT_STR)
                        rpcmsg->method.assign(o->val.via.str.ptr, o->val.via.str.size);
                }
                else if (str == "params") {
                    rpcmsg->params = o->val;
                }
                else if (str == "result") {
                    rpcmsg->result = o->val;
                }
                else if (str == "error") {
                    if (o->val.type == MSGPACK_OBJECT_MAP) {
                        for (uint32_t n = 0; n < o->val.via.map.size; n++) {
                            auto p = o->val.via.map.ptr + n;
                            if (p->key.type == MSGPACK_OBJECT_STR && memcmp(p->key.via.str.ptr, "code", 4) == 0) {
                                if (p->val.type == MSGPACK_OBJECT_NEGATIVE_INTEGER)
                                    rpcmsg->err_code = (int)p->val.via.i64;
                                else if (p->val.type == MSGPACK_OBJECT_POSITIVE_INTEGER)
                                    rpcmsg->err_code = (int)p->val.via.u64;
                            }
                            else if (p->key.type == MSGPACK_OBJECT_STR && memcmp(p->key.via.str.ptr, "message", 7) == 0) {
                                if (p->val.type == MSGPACK_OBJECT_STR)
                                    rpcmsg->err_msg.assign(p->val.via.str.ptr, p->val.via.str.size);
                            }
                        }
                    }
                }
#if 0
                else if (str == "debug") {
                    if (o->val.type == MSGPACK_OBJECT_MAP) {
                        uint64_t recv_time = 0;
                        uint64_t send_time = 0;
                        for (uint32_t n = 0; n < o->val.via.map.size; n++) {
                            auto p = o->val.via.map.ptr + n;
                            if (p->key.type == MSGPACK_OBJECT_STR) {
                                if (memcmp(p->key.via.str.ptr, "recv_time", 9) == 0)
                                    recv_time = p->val.via.u64;
                                else if (memcmp(p->key.via.str.ptr, "send_time", 9) == 0)
                                    send_time = p->val.via.u64;
                            }
                        }
                        std::cout << "rsp_time: " << rpcmsg->method << " "
                            << (send_time - recv_time) << " "
                            << time_point_cast<microseconds>(system_clock::now()).time_since_epoch().count() - recv_time
                            << endl;
                    }
                }
#endif
            }
            return rpcmsg;
        }
        catch (exception& e) {
            cerr << "parse conf failure: " << e.what();
            return nullptr;
        }
    }